

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O3

dgRedBackNode * __thiscall dgRedBackNode::Prev(dgRedBackNode *this)

{
  dgRedBackNode *pdVar1;
  dgRedBackNode *pdVar2;
  bool bVar3;
  
  pdVar1 = this->m_left;
  if (this->m_left == (dgRedBackNode *)0x0) {
    do {
      pdVar2 = this->m_parent;
      if (pdVar2 == (dgRedBackNode *)0x0) {
        return (dgRedBackNode *)0x0;
      }
      bVar3 = this == pdVar2->m_left;
      this = pdVar2;
    } while (bVar3);
  }
  else {
    do {
      pdVar2 = pdVar1;
      pdVar1 = pdVar2->m_right;
    } while (pdVar2->m_right != (dgRedBackNode *)0x0);
  }
  return pdVar2;
}

Assistant:

dgRedBackNode *dgRedBackNode::Prev () const
{
	if (m_left) {
		return m_left->Maximum ();
	}

	dgRedBackNode* node = (dgRedBackNode *)this;
	dgRedBackNode* ptr = m_parent;
	for (; ptr && node == ptr->m_left; ptr = ptr->m_parent) {
		node = ptr;
	}
	return ptr;

}